

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_18::FunctionInfoScanner::visitFunction(FunctionInfoScanner *this,Function *curr)

{
  uint uVar1;
  bool bVar2;
  Index IVar3;
  mapped_type *pmVar4;
  Call *pCVar5;
  size_t sVar6;
  Call *call;
  mapped_type *info;
  Function *curr_local;
  FunctionInfoScanner *this_local;
  
  pmVar4 = std::
           unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
           ::operator[](this->infos,(key_type *)curr);
  bVar2 = canHandleParams(curr);
  if (!bVar2) {
    pmVar4->inliningMode = Uninlineable;
  }
  IVar3 = Measurer::measure(curr->body);
  pmVar4->size = IVar3;
  pCVar5 = Expression::dynCast<wasm::Call>(curr->body);
  if ((pCVar5 != (Call *)0x0) &&
     (uVar1 = pmVar4->size,
     sVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pCVar5->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
     , (ulong)uVar1 == sVar6 + 1)) {
    pmVar4->isTrivialCall = true;
  }
  return;
}

Assistant:

void visitFunction(Function* curr) {
    auto& info = infos[curr->name];

    if (!canHandleParams(curr)) {
      info.inliningMode = InliningMode::Uninlineable;
    }

    info.size = Measurer::measure(curr->body);

    if (auto* call = curr->body->dynCast<Call>()) {
      if (info.size == call->operands.size() + 1) {
        // This function body is a call with some trivial (size 1) operands like
        // LocalGet or Const, so it is a trivial call.
        info.isTrivialCall = true;
      }
    }
  }